

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3243.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementBeamANCF_3243::EvaluateSectionPoint
          (ChElementBeamANCF_3243 *this,double xi,ChVector<double> *point)

{
  PointerType ptr;
  undefined1 auVar1 [32];
  undefined1 auVar2 [64];
  undefined1 auVar3 [16];
  double dVar4;
  double dVar7;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  VectorN Sxi_compact;
  Matrix3xN e_bar;
  DenseStorage<double,_8,_8,_1,_0> local_180;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  Calc_Sxi_compact(this,(VectorN *)&local_180,xi,0.0,0.0);
  CalcCoordMatrix(this,(Matrix3xN *)local_140);
  auVar2 = vmulpd_avx512f((undefined1  [64])local_180.m_data.array,local_140);
  auVar1 = vextractf64x4_avx512f(auVar2,1);
  dVar4 = auVar2._0_8_ + auVar1._0_8_ + auVar2._8_8_ + auVar1._8_8_;
  dVar7 = auVar2._16_8_ + auVar1._16_8_ + auVar2._24_8_ + auVar1._24_8_;
  auVar5._0_8_ = dVar4 + dVar7;
  auVar5._8_8_ = dVar4 + dVar7;
  dVar4 = (double)vmovlpd_avx(auVar5);
  point->m_data[0] = dVar4;
  auVar2 = vmulpd_avx512f((undefined1  [64])local_180.m_data.array,local_100);
  auVar1 = vextractf64x4_avx512f(auVar2,1);
  dVar4 = auVar2._0_8_ + auVar1._0_8_ + auVar2._8_8_ + auVar1._8_8_;
  dVar7 = auVar2._16_8_ + auVar1._16_8_ + auVar2._24_8_ + auVar1._24_8_;
  auVar6._0_8_ = dVar4 + dVar7;
  auVar6._8_8_ = dVar4 + dVar7;
  dVar4 = (double)vmovlpd_avx(auVar6);
  point->m_data[1] = dVar4;
  auVar2 = vmulpd_avx512f((undefined1  [64])local_180.m_data.array,local_c0);
  auVar1 = vextractf64x4_avx512f(auVar2,1);
  dVar4 = auVar2._0_8_ + auVar1._0_8_ + auVar2._8_8_ + auVar1._8_8_;
  dVar7 = auVar2._16_8_ + auVar1._16_8_ + auVar2._24_8_ + auVar1._24_8_;
  auVar3._0_8_ = dVar4 + dVar7;
  auVar3._8_8_ = dVar4 + dVar7;
  dVar4 = (double)vmovlpd_avx(auVar3);
  point->m_data[2] = dVar4;
  return;
}

Assistant:

void ChElementBeamANCF_3243::EvaluateSectionPoint(const double xi, ChVector<>& point) {
    VectorN Sxi_compact;
    Calc_Sxi_compact(Sxi_compact, xi, 0, 0);

    Matrix3xN e_bar;
    CalcCoordMatrix(e_bar);

    // r = S*e written in compact form
    point = e_bar * Sxi_compact;
}